

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::EntryPointInfo::SetCodeGenDone(EntryPointInfo *this)

{
  code *pcVar1;
  State SVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  nullptr_t local_18;
  EntryPointInfo *local_10;
  EntryPointInfo *this_local;
  
  local_10 = this;
  SVar2 = GetState(this);
  if (SVar2 != CodeGenRecorded) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x207e,"(this->GetState() == CodeGenRecorded)",
                                "this->GetState() == CodeGenRecorded");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this->state = CodeGenDone;
  local_18 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<CodeGenWorkItem>::operator=(&this->workItem,&local_18);
  bVar3 = IsLoopBody(this);
  if (bVar3) {
    iVar4 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])();
    FunctionBody::SetHasDoneLoopBodyCodeGen((FunctionBody *)CONCAT44(extraout_var,iVar4),true);
  }
  return;
}

Assistant:

void EntryPointInfo::SetCodeGenDone()
    {
        Assert(this->GetState() == CodeGenRecorded);
        this->state = CodeGenDone;
        this->workItem = nullptr;
        if (this->IsLoopBody())
        {
            this->GetFunctionBody()->SetHasDoneLoopBodyCodeGen(true);
        }
    }